

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

bool __thiscall soul::heart::Function::mayHaveSideEffects(Function *this)

{
  pointer ppVar1;
  int iVar2;
  Statement *s;
  Statement *pSVar3;
  pool_ref<soul::heart::Block> *b;
  pointer ppVar4;
  
  ppVar4 = (this->blocks).
           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->blocks).
           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar4 == ppVar1) {
      return false;
    }
    for (pSVar3 = (ppVar4->object->statements).firstObject; pSVar3 != (Statement *)0x0;
        pSVar3 = pSVar3->nextObject) {
      iVar2 = (*(pSVar3->super_Object)._vptr_Object[5])(pSVar3);
      if ((char)iVar2 != '\0') {
        return true;
      }
    }
    ppVar4 = ppVar4 + 1;
  } while( true );
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn)
        {
            for (auto p : parameters)
                p->visitExpressions (fn, AccessType::read);

            for (auto s : statements)
                s->visitExpressions (fn);

            if (terminator != nullptr)
                terminator->visitExpressions (fn);
        }